

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedDirectory.cpp
# Opt level: O1

bool __thiscall SharedDirectory::can_create_file(SharedDirectory *this,uint64_t size,string *name)

{
  pointer pcVar1;
  bool bVar2;
  char cVar3;
  iterator iVar4;
  bool bVar5;
  undefined1 local_70 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  path local_48;
  
  if (size - 1 < this->remaining_space) {
    cVar3 = boost::filesystem::portable_name((string *)name);
    if (cVar3 == '\0') goto LAB_0010f54c;
    local_70._8_8_ = &local_58;
    pcVar1 = (name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_70 + 8),pcVar1,pcVar1 + name->_M_string_length);
    path_in_dir(&local_48,this,(string *)(local_70 + 8));
    boost::filesystem::detail::status((path *)local_70,(error_code *)&local_48);
    bVar2 = true;
    bVar5 = true;
    if ((uint)local_70._0_4_ < 2) {
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      *)this,name);
      if ((_Rb_tree_header *)iVar4._M_node ==
          &(this->indexed_files)._M_t._M_impl.super__Rb_tree_header) {
        iVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                ::find(&(this->pending_files)._M_t,name);
        bVar5 = (_Rb_tree_header *)iVar4._M_node ==
                &(this->pending_files)._M_t._M_impl.super__Rb_tree_header;
        goto LAB_0010f550;
      }
    }
  }
  else {
LAB_0010f54c:
    bVar5 = false;
  }
  bVar2 = bVar5;
  bVar5 = false;
LAB_0010f550:
  if (bVar2) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.m_pathname._M_dataplus._M_p != &local_48.m_pathname.field_2) {
      operator_delete(local_48.m_pathname._M_dataplus._M_p,
                      local_48.m_pathname.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._8_8_ != &local_58) {
      operator_delete((void *)local_70._8_8_,local_58._M_allocated_capacity + 1);
    }
  }
  return bVar5;
}

Assistant:

bool SharedDirectory::can_create_file(uint64_t size, const std::string &name) {
  return size <= this->remaining_space && size > 0
      && portable_name(name)
      && !exists(path_in_dir(name))
      && (indexed_files.find(name) == indexed_files.end())
      && (pending_files.find(name) == pending_files.end());
}